

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O1

int main(void)

{
  auto_ptr<const_viennamath::rt_expression_interface<double>_> aVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  rt_expression_interface<double> *prVar6;
  op_interface<viennamath::rt_expression_interface<double>_> *poVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  void *__child_stack_03;
  void *__child_stack_04;
  __fn *p_Var9;
  void *in_R8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  ct_constant<8L> c8;
  expr e;
  expr e2;
  variable x;
  expr e1;
  rt_constant<long,_viennamath::rt_expression_interface<double>_> c6;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> c4;
  variable y;
  expr e3;
  variable z;
  ct_constant<8L> local_129;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_128;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_120;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_100;
  rt_variable<viennamath::rt_expression_interface<double>_> local_f8;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_e8;
  rt_constant<long,_viennamath::rt_expression_interface<double>_> local_e0;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> local_d0;
  rt_variable<viennamath::rt_expression_interface<double>_> local_c0;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_b0;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_a8;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_a0;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_98;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_90;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_88;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_68;
  rt_variable<viennamath::rt_expression_interface<double>_> local_50;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> local_40;
  
  local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001301a0;
  local_f8.id_ = 0;
  local_c0.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001301a0;
  local_c0.id_ = 1;
  local_50.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001301a0;
  local_50.id_ = 2;
  local_d0.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001303a0;
  local_d0.s = 4.0;
  local_e0.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_00130460;
  local_e0.s = 6;
  prVar6 = (rt_expression_interface<double> *)operator_new(0x10);
  prVar6->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_001301a0;
  prVar6[1]._vptr_rt_expression_interface = (_func_int **)0x0;
  poVar7 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar7->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130520;
  local_120.rhs_._M_ptr = (rt_expression_interface<double> *)operator_new(0x10);
  (local_120.rhs_._M_ptr)->_vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001301a0;
  local_120.rhs_._M_ptr[1]._vptr_rt_expression_interface = (_func_int **)0x1;
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  local_120.lhs_._M_ptr = prVar6;
  local_120.op_._M_ptr = poVar7;
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_e8,&local_120);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_120.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_120.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_120.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_120.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar3 = (*local_d0.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  poVar7 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar7->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130520;
  local_120.rhs_._M_ptr = (rt_expression_interface<double> *)operator_new(0x10);
  (local_120.rhs_._M_ptr)->_vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001303a0;
  iVar5 = 0;
  local_120.rhs_._M_ptr[1]._vptr_rt_expression_interface = (_func_int **)0x4020000000000000;
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  local_120.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar3);
  local_120.op_._M_ptr = poVar7;
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100,&local_120);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_120.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_120.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_120.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_120.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar3 = (*(local_e8._M_ptr)->_vptr_rt_expression_interface[2])();
  poVar7 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar7->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130520;
  iVar4 = (*(local_100._M_ptr)->_vptr_rt_expression_interface[2])();
  local_120.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_01,iVar4);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  local_120.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar3);
  local_120.op_._M_ptr = poVar7;
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_90,&local_120);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_120.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_120.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_120.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_120.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_128._M_ptr = (rt_expression_interface<double> *)0x0;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_e8,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_e8,&local_f8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_e8,&local_d0);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_e8,&local_e0);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_e8,&local_129);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)0x4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_e8,(double *)&local_120
            );
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_f8,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_f8,&local_f8
            );
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_f8,&local_d0
            );
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_f8,&local_e0
            );
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_f8,
             &local_129);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)0x4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,double>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_f8,
             (double *)&local_120);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_c0,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_c0,&local_f8
            );
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_c0,&local_d0
            );
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_c0,&local_e0
            );
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_c0,
             &local_129);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)0x4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,double>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_c0,
             (double *)&local_120);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_d0,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_d0,&local_f8
            );
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_d0,&local_d0
             ,local_d0.s,local_d0.s);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_d0,&local_e0
             ,local_d0.s,(double)local_e0.s);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_d0,
             &local_129,local_d0.s,8.0);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)0x4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,double>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_d0,
             (double *)&local_120,local_d0.s,2.7172);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_e0,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_e0,&local_f8
            );
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_e0,&local_d0
             ,(double)local_e0.s,local_d0.s);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_e0,&local_e0
             ,(double)local_e0.s,(double)local_e0.s);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_e0,
             &local_129,(double)local_e0.s,8.0);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)0x4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,double>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_e0,
             (double *)&local_120,(double)local_e0.s,2.7172);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_129,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_129,
             &local_f8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_129,
             &local_d0,8.0,local_d0.s);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_129,
             &local_e0,8.0,(double)local_e0.s);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,viennamath::ct_constant<8l>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_129,
             &local_129,8.0,8.0);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)0x4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,double>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,&local_129,
             (double *)&local_120,8.0,2.7172);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)0x4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,
             (double *)&local_120,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)0x4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,
             (double *)&local_120,&local_f8);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)0x4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,
             (double *)&local_120,&local_d0,2.7172,local_d0.s);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)0x4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,
             (double *)&local_120,&local_e0,2.7172,(double)local_e0.s);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)0x4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,viennamath::ct_constant<8l>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,
             (double *)&local_120,&local_129,2.7172,8.0);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)0x4005bcd35a858794;
  local_88.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)0x4005bcd35a858794;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,double>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128,
             (double *)&local_120,(double *)&local_88,2.7172,2.7172);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"************************************************",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"*****     TEST COMPLETED SUCCESSFULLY!     *****",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"************************************************",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  poVar8 = viennamath::operator<<((ostream *)&std::cout,&local_f8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
  local_40.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001301a0;
  local_40.s = (double)local_f8.id_;
  viennamath::rt_variable<viennamath::rt_expression_interface<double>>::operator()
            ((rt_variable<viennamath::rt_expression_interface<double>> *)&local_120,&local_40);
  poVar8 = std::ostream::_M_insert<double>((double)local_120.lhs_._M_ptr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  poVar8 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_98,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  (*(local_98._M_ptr)->_vptr_rt_expression_interface[6])(local_d0.s);
  poVar8 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  p_Var9 = (__fn *)(ulong)(uint)(int)cVar2;
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (local_98._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_98._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar3 = (*local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  poVar7 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar7->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130520;
  iVar4 = (*(local_100._M_ptr)->_vptr_rt_expression_interface[2])();
  local_120.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_03,iVar4);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  local_120.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_02,iVar3);
  local_120.op_._M_ptr = poVar7;
  iVar3 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_120,p_Var9,__child_stack,iVar5,in_R8);
  prVar6 = (rt_expression_interface<double> *)CONCAT44(extraout_var_04,iVar3);
  aVar1._M_ptr = local_128._M_ptr;
  if ((local_128._M_ptr != prVar6) &&
     (aVar1._M_ptr = prVar6, local_128._M_ptr != (rt_expression_interface<double> *)0x0)) {
    (*(local_128._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_128._M_ptr = aVar1._M_ptr;
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_120.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_120.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_120.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_120.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  poVar8 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_a0,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128);
  (*(local_a0._M_ptr)->_vptr_rt_expression_interface[6])(local_d0.s);
  poVar8 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (local_a0._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_a0._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  poVar8 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_a8,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128);
  (*(local_a8._M_ptr)->_vptr_rt_expression_interface[6])((double)local_e0.s);
  poVar8 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_01);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (local_a8._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_a8._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  poVar8 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_b0,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128);
  (*(local_b0._M_ptr)->_vptr_rt_expression_interface[6])(0x4020000000000000);
  poVar8 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_02);
  cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  p_Var9 = (__fn *)(ulong)(uint)(int)cVar2;
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (local_b0._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_b0._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  unary_test<viennamath::rt_variable<viennamath::rt_expression_interface<double>>>(&local_f8);
  iVar3 = (*local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  poVar7 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar7->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130520;
  iVar5 = (*local_d0.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  local_120.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_06,iVar5);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  local_120.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_05,iVar3);
  local_120.op_._M_ptr = poVar7;
  unary_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>(&local_120);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_120.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_120.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_120.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_120.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar3 = (*local_c0.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  poVar7 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar7->_vptr_op_interface = (_func_int **)&PTR__op_interface_001306d0;
  iVar5 = (*local_e0.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  local_120.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_08,iVar5);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  local_120.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_07,iVar3);
  local_120.op_._M_ptr = poVar7;
  unary_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>(&local_120);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_120.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_120.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_120.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_120.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar3 = (*local_c0.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  poVar7 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar7->_vptr_op_interface = (_func_int **)&PTR__op_interface_001307d0;
  iVar5 = (*local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  local_120.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_10,iVar5);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  local_120.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_09,iVar3);
  local_120.op_._M_ptr = poVar7;
  unary_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>(&local_120);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_120.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_120.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_120.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_120.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar3 = (*local_e0.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  poVar7 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar7->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130520;
  local_120.rhs_._M_ptr = (rt_expression_interface<double> *)operator_new(0x10);
  (local_120.rhs_._M_ptr)->_vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001303a0;
  iVar5 = 0;
  local_120.rhs_._M_ptr[1]._vptr_rt_expression_interface = (_func_int **)0x4020000000000000;
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  local_120.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_11,iVar3);
  local_120.op_._M_ptr = poVar7;
  unary_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>(&local_120);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_120.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_120.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_120.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_120.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  iVar3 = (*local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  poVar7 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar7->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130640;
  iVar4 = (*local_d0.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  local_88.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_13,iVar4);
  local_88.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  local_88.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_12,iVar3);
  local_88.op_._M_ptr = poVar7;
  iVar3 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_88,p_Var9,__child_stack_00,iVar5,in_R8);
  poVar7 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar7->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130640;
  iVar4 = (*local_c0.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  local_120.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_15,iVar4);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  local_120.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_14,iVar3);
  local_120.op_._M_ptr = poVar7;
  iVar3 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_120,p_Var9,__child_stack_01,iVar5,in_R8);
  prVar6 = (rt_expression_interface<double> *)CONCAT44(extraout_var_16,iVar3);
  aVar1._M_ptr = local_128._M_ptr;
  if ((local_128._M_ptr != prVar6) &&
     (aVar1._M_ptr = prVar6, local_128._M_ptr != (rt_expression_interface<double> *)0x0)) {
    (*(local_128._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_128._M_ptr = aVar1._M_ptr;
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_120.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_120.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_120.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_120.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_88.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_88.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_88.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_88.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_88.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_88.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_88.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Replacing x in ",0xf);
  poVar8 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," with ",6);
  poVar8 = viennamath::operator<<(poVar8,&local_e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," leads to ",10);
  viennamath::
  substitute<viennamath::rt_expression_interface<double>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            ((viennamath *)&local_120,&local_f8,&local_e0,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128);
  poVar8 = viennamath::operator<<
                     (poVar8,(rt_expr<viennamath::rt_expression_interface<double>_> *)&local_120);
  cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  p_Var9 = (__fn *)(ulong)(uint)(int)cVar2;
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface !=
      (_func_int **)0x0) {
    (**(code **)(*local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface + 8)
    )();
  }
  iVar3 = (*local_f8.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  local_68.op_._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  iVar4 = 0x130d20;
  (local_68.op_._M_ptr)->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130d20;
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  local_68.expr_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_17,iVar3);
  iVar3 = viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,p_Var9,__child_stack_02,0x130d20,in_R8);
  poVar7 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar7->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130640;
  iVar5 = (*local_d0.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  local_88.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_19,iVar5);
  local_88.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  local_88.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_18,iVar3);
  local_88.op_._M_ptr = poVar7;
  iVar3 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_88,p_Var9,__child_stack_03,iVar4,in_R8);
  poVar7 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar7->_vptr_op_interface = (_func_int **)&PTR__op_interface_00130640;
  iVar5 = (*local_c0.super_rt_expression_interface<double>._vptr_rt_expression_interface[2])();
  local_120.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_21,iVar5);
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  local_120.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_20,iVar3);
  local_120.op_._M_ptr = poVar7;
  iVar3 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_120,p_Var9,__child_stack_04,iVar4,in_R8);
  prVar6 = (rt_expression_interface<double> *)CONCAT44(extraout_var_22,iVar3);
  aVar1._M_ptr = local_128._M_ptr;
  if ((local_128._M_ptr != prVar6) &&
     (aVar1._M_ptr = prVar6, local_128._M_ptr != (rt_expression_interface<double> *)0x0)) {
    (*(local_128._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_128._M_ptr = aVar1._M_ptr;
  local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_120.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_120.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_120.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_120.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_120.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_88.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001300d0;
  if (local_88.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_88.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_88.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_88.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_88.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_88.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Replacing x in ",0xf);
  poVar8 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," with ",6);
  poVar8 = viennamath::operator<<(poVar8,&local_e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," leads to ",10);
  viennamath::
  substitute<viennamath::rt_expression_interface<double>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            ((viennamath *)&local_120,&local_f8,&local_e0,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128);
  poVar8 = viennamath::operator<<
                     (poVar8,(rt_expr<viennamath::rt_expression_interface<double>_> *)&local_120);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface !=
      (_func_int **)0x0) {
    (**(code **)(*local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface + 8)
    )();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--- Involved types ---",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x: ",3);
  poVar8 = viennamath::operator<<((ostream *)&std::cout,&local_f8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"y: ",3);
  poVar8 = viennamath::operator<<((ostream *)&std::cout,&local_c0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"z: ",3);
  poVar8 = viennamath::operator<<((ostream *)&std::cout,&local_50);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"c4: ",4);
  poVar8 = viennamath::operator<<((ostream *)&std::cout,&local_d0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"c6: ",4);
  poVar8 = viennamath::operator<<((ostream *)&std::cout,&local_e0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"c8: ",4);
  poVar8 = viennamath::operator<<((ostream *)&std::cout,&local_129);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"e1: ",4);
  poVar8 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_e8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"e2: ",4);
  poVar8 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_100);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"e3: ",4);
  poVar8 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_90);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"e: ",3);
  poVar8 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_128);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"************************************************",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"*****     TEST COMPLETED SUCCESSFULLY!     *****",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"************************************************",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  if (local_128._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_128._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_90._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_90._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_100._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_100._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_e8._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_e8._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  return 0;
}

Assistant:

int main()
{
  viennamath::variable x(0);
  viennamath::variable y(1);
  viennamath::variable z(2);
  viennamath::rt_constant<double> c4(4.0);
  viennamath::rt_constant<long> c6(6);
  viennamath::ct_constant<8> c8;
  viennamath::expr e1 = x + y;
  viennamath::expr e2 = c4 + c8;
  viennamath::expr e3 = e1 + e2;
  viennamath::expr e;

  //compilation checks:
  operations_test(e, e1, e2);
  operations_test(e, e1, x);
  operations_test(e, e1, c4);
  operations_test(e, e1, c6);
  operations_test(e, e1, c8);
  operations_test(e, e1, 2.7172);

  operations_test(e, x, e2);
  operations_test(e, x, x);
  operations_test(e, x, c4);
  operations_test(e, x, c6);
  operations_test(e, x, c8);
  operations_test(e, x, 2.7172);

  operations_test(e, y, e2);
  operations_test(e, y, x);
  operations_test(e, y, c4);
  operations_test(e, y, c6);
  operations_test(e, y, c8);
  operations_test(e, y, 2.7172);

  operations_test(e, c4, e2);
  operations_test(e, c4, x);
  operations_test(e, c4, c4);
  operations_test(e, c4, c6);
  operations_test(e, c4, c8);
  operations_test(e, c4, 2.7172);

  operations_test(e, c6, e2);
  operations_test(e, c6, x);
  operations_test(e, c6, c4);
  operations_test(e, c6, c6);
  operations_test(e, c6, c8);
  operations_test(e, c6, 2.7172);

  operations_test(e, c8, e2);
  operations_test(e, c8, x);
  operations_test(e, c8, c4);
  operations_test(e, c8, c6);
  operations_test(e, c8, c8);
  operations_test(e, c8, 2.7172);

  operations_test(e, 2.7172, e2);
  operations_test(e, 2.7172, x);
  operations_test(e, 2.7172, c4);
  operations_test(e, 2.7172, c6);
  operations_test(e, 2.7172, c8);
  operations_test(e, 2.7172, 2.7172);

  std::cout << "************************************************" << std::endl;
  std::cout << "*****     TEST COMPLETED SUCCESSFULLY!     *****" << std::endl;
  std::cout << "************************************************" << std::endl;
  std::cout << std::endl;


  std::cout << x << ": " << viennamath::eval(x, c4) << std::endl;
  std::cout << e2  << ": " << viennamath::eval(e2, c4) << std::endl;
  e = x + e2;
  std::cout << e << ": " << viennamath::eval(e, c4) << std::endl;
  std::cout << e << ": " << viennamath::eval(e, c6) << std::endl;
  std::cout << e << ": " << viennamath::eval(e, c8) << std::endl;

  unary_test(x);
  unary_test(x+c4);
  unary_test(y*c6);
  unary_test(y/x);
  unary_test(c6+c8);



  e = x - c4 - y;
  std::cout << "Replacing x in " << e
            << " with " << c6
            << " leads to " << viennamath::substitute(x, c6, e) << std::endl;

  e = viennamath::exp(x) - c4 - y;
  std::cout << "Replacing x in " << e
            << " with " << c6
            << " leads to " << viennamath::substitute(x, c6, e) << std::endl;

  std::cout << "--- Involved types ---" << std::endl;
  std::cout << "x: " << x << std::endl;
  std::cout << "y: " << y << std::endl;
  std::cout << "z: " << z << std::endl;
  std::cout << "c4: " << c4 << std::endl;
  std::cout << "c6: " << c6 << std::endl;
  std::cout << "c8: " << c8 << std::endl;
  std::cout << "e1: " << e1 << std::endl;
  std::cout << "e2: " << e2 << std::endl;
  std::cout << "e3: " << e3 << std::endl;
  std::cout << "e: " << e << std::endl;

  std::cout << std::endl;

  std::cout << "************************************************" << std::endl;
  std::cout << "*****     TEST COMPLETED SUCCESSFULLY!     *****" << std::endl;
  std::cout << "************************************************" << std::endl;


  return EXIT_SUCCESS;
}